

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

Promise<int> __thiscall kj::UnixEventPort::onChildExit(UnixEventPort *this,Maybe<int> *pid)

{
  Maybe<int> *in_RDX;
  NullableValue<int> adapterConstructorParams;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  NullableValue<int> local_30;
  
  _kjCondition.value = (bool *)&(anonymous_namespace)::capturedChildExit;
  if ((anonymous_namespace)::capturedChildExit == '\0') {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&,char_const(&)[66]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x121,FAILED,"capturedChildExit",
               "_kjCondition,\"must call UnixEventPort::captureChildExit() to use onChildExit().\"",
               &_kjCondition,
               (char (*) [66])"must call UnixEventPort::captureChildExit() to use onChildExit().");
    kj::_::Debug::Fault::fatal(&f);
  }
  adapterConstructorParams = pid[0x1e].ptr;
  if (pid[0x1e].ptr == (NullableValue<int>)0x0) {
    f.exception = (Exception *)
                  (CONCAT71(f.exception._1_7_,(char)(anonymous_namespace)::threadClaimedChildExits)
                  ^ 1);
    if ((char)(anonymous_namespace)::threadClaimedChildExits == '\x01') {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[62]>
                ((Fault *)&_kjCondition,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
                 ,0x12a,FAILED,"!threadClaimedChildExits",
                 "_kjCondition,\"only one UnixEvertPort per process may listen for child exits\"",
                 (DebugExpression<bool> *)&f,
                 (char (*) [62])"only one UnixEvertPort per process may listen for child exits");
      kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
    }
    (anonymous_namespace)::threadClaimedChildExits._0_1_ = '\x01';
    heap<kj::UnixEventPort::ChildSet>();
    f.exception = (Exception *)_kjCondition.value;
    Own<kj::UnixEventPort::ChildSet,_std::nullptr_t>::operator=
              ((Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)(pid + 0x1d),
               (Own<kj::UnixEventPort::ChildSet,_std::nullptr_t> *)&f);
    adapterConstructorParams = local_30;
    if (local_30 != (NullableValue<int>)0x0) {
      (**(code **)((f.exception)->ownFile).content.ptr)();
    }
  }
  newAdaptedPromise<int,kj::UnixEventPort::ChildExitPromiseAdapter,kj::UnixEventPort::ChildSet&,kj::Maybe<int>&>
            ((kj *)this,(ChildSet *)adapterConstructorParams,in_RDX);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<int> UnixEventPort::onChildExit(Maybe<pid_t>& pid) {
  KJ_REQUIRE(capturedChildExit,
      "must call UnixEventPort::captureChildExit() to use onChildExit().");

  ChildSet* cs;
  KJ_IF_SOME(c, childSet) {
    cs = c;
  } else {
    // In theory we should do an atomic compare-and-swap on threadClaimedChildExits, but this is
    // for debug purposes only so it's not a big deal.
    KJ_REQUIRE(!threadClaimedChildExits,
        "only one UnixEvertPort per process may listen for child exits");
    threadClaimedChildExits = true;

    auto newChildSet = kj::heap<ChildSet>();
    cs = newChildSet;
    childSet = kj::mv(newChildSet);
  }